

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.c
# Opt level: O0

int dobind(KEYMAP *curmap,char *p,int unbind)

{
  byte bVar1;
  int iVar2;
  PF p_Var3;
  char *pcVar4;
  KEYMAP *pKVar5;
  uint local_a4;
  int local_a0;
  int n;
  int s;
  int c;
  char *pep;
  char *bufp;
  char bprompt [80];
  PF funct;
  KEYMAP *pref_map;
  int unbind_local;
  char *p_local;
  KEYMAP *curmap_local;
  
  funct = (PF)0x0;
  p_local = (char *)curmap;
  if (macrodef != 0) {
    iVar2 = dobeep_msg("Can\'t rebind key in macro");
    return iVar2;
  }
  if (inmacro == 0) {
    local_a4 = strlcpy(&bufp,p,0x50);
    if (0x4f < local_a4) {
      local_a4 = 0x4f;
    }
    _s = bprompt + (long)(int)local_a4 + -8;
    while( true ) {
      ewprintf("%s",&bufp);
      _s[-1] = ' ';
      n = getkey(0);
      pcVar4 = getkeyname(_s,0x50 - ((long)_s - (long)&bufp),n);
      p_Var3 = doscan((KEYMAP *)p_local,n,(KEYMAP **)&p_local);
      if (p_Var3 != (PF)0x0) break;
      _s = pcVar4 + 1;
      *pcVar4 = '-';
      *_s = '\0';
    }
  }
  else {
    for (local_a0 = 0; local_a0 < maclcur->l_used + -1; local_a0 = local_a0 + 1) {
      bVar1 = maclcur->l_text[local_a0];
      p_Var3 = doscan((KEYMAP *)p_local,(uint)bVar1,(KEYMAP **)&p_local);
      if ((p_Var3 != (PF)0x0) &&
         (iVar2 = remap((KEYMAP *)p_local,(uint)bVar1,(PF)0x0,(KEYMAP *)0x0), iVar2 != 1)) {
        return 0;
      }
    }
    n = (int)maclcur->l_text[local_a0];
    doscan((KEYMAP *)p_local,n,(KEYMAP **)0x0);
    maclcur = maclcur->l_fp;
  }
  if (unbind == 0) {
    pcVar4 = eread("%s to command: ",(char *)&bufp,0x50,9,&bufp);
    if (pcVar4 == (char *)0x0) {
      return 2;
    }
    if (*pcVar4 == '\0') {
      return 0;
    }
    bprompt._72_8_ = name_function((char *)&bufp);
    pKVar5 = (KEYMAP *)bprompt._72_8_;
    if ((KEYMAP *)bprompt._72_8_ == (KEYMAP *)0x0) {
      funct = (PF)name_map((char *)&bufp);
      pKVar5 = (KEYMAP *)funct;
    }
    if (pKVar5 == (KEYMAP *)0x0) {
      iVar2 = dobeep_msg("[No match]");
      return iVar2;
    }
  }
  else {
    bprompt._72_8_ = rescan;
  }
  iVar2 = remap((KEYMAP *)p_local,n,(PF)bprompt._72_8_,(KEYMAP *)funct);
  return iVar2;
}

Assistant:

static int
dobind(KEYMAP *curmap, const char *p, int unbind)
{
	KEYMAP	*pref_map = NULL;
	PF	 funct;
	char	 bprompt[80], *bufp, *pep;
	int	 c, s, n;

	if (macrodef) {
		/*
		 * Keystrokes aren't collected. Not hard, but pretty useless.
		 * Would not work for function keys in any case.
		 */
		return (dobeep_msg("Can't rebind key in macro"));
	}
	if (inmacro) {
		for (s = 0; s < maclcur->l_used - 1; s++) {
			if (doscan(curmap, c = CHARMASK(maclcur->l_text[s]), &curmap)
			    != NULL) {
				if (remap(curmap, c, NULL, NULL)
				    != TRUE)
					return (FALSE);
			}
		}
		(void)doscan(curmap, c = maclcur->l_text[s], NULL);
		maclcur = maclcur->l_fp;
	} else {
		n = strlcpy(bprompt, p, sizeof(bprompt));
		if (n >= sizeof(bprompt))
			n = sizeof(bprompt) - 1;
		pep = bprompt + n;
		for (;;) {
			ewprintf("%s", bprompt);
			pep[-1] = ' ';
			pep = getkeyname(pep, sizeof(bprompt) -
			    (pep - bprompt), c = getkey(FALSE));
			if (doscan(curmap, c, &curmap) != NULL)
				break;
			*pep++ = '-';
			*pep = '\0';
		}
	}
	if (unbind)
		funct = rescan;
	else {
		if ((bufp = eread("%s to command: ", bprompt, sizeof(bprompt),
		    EFFUNC | EFNEW, bprompt)) == NULL)
			return (ABORT);
		else if (bufp[0] == '\0')
			return (FALSE);
		if (((funct = name_function(bprompt)) == NULL) ?
		    (pref_map = name_map(bprompt)) == NULL : funct == NULL)
			return (dobeep_msg("[No match]"));

	}
	return (remap(curmap, c, funct, pref_map));
}